

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O2

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  Mat local_90;
  int local_44;
  int local_40;
  int local_3c;
  Option *local_38;
  
  uVar1 = bottom_blob->dims;
  local_44 = bottom_blob->w;
  local_40 = bottom_blob->h;
  local_3c = bottom_blob->c;
  pvVar3 = (this->axes).data;
  if ((pvVar3 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar16 = this->squeeze_w != 0 && local_44 == 1;
    bVar15 = this->squeeze_h != 0 && local_40 == 1;
    bVar12 = this->squeeze_c != 0 && local_3c == 1;
  }
  else {
    uVar2 = (this->axes).w;
    bVar17 = local_44 == 1;
    uVar13 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar13;
    }
    bVar16 = false;
    bVar15 = false;
    bVar12 = false;
    for (; local_38 = opt, uVar11 != uVar13; uVar13 = uVar13 + 1) {
      iVar14 = *(int *)((long)pvVar3 + uVar13 * 4);
      iVar14 = (iVar14 >> 0x1f & uVar1) + iVar14;
      bVar5 = bVar16;
      bVar7 = bVar15;
      bVar8 = bVar12;
      if (iVar14 == 0) {
        bVar5 = bVar17;
        bVar7 = local_40 == 1;
        bVar8 = local_3c == 1;
      }
      if (uVar1 != 2) {
        bVar7 = bVar15;
      }
      if (uVar1 != 1) {
        bVar5 = bVar16;
      }
      bVar6 = bVar5;
      bVar15 = bVar7;
      if (iVar14 == 1) {
        bVar6 = bVar17;
        bVar15 = local_40 == 1;
      }
      if (uVar1 != 2) {
        bVar6 = bVar5;
      }
      bVar16 = bVar6;
      if (iVar14 == 2) {
        bVar16 = bVar17;
      }
      if (uVar1 != 3) {
        bVar16 = bVar6;
        bVar15 = bVar7;
        bVar8 = bVar12;
      }
      bVar12 = bVar8;
    }
  }
  if (top_blob != bottom_blob) {
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar4 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar4;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar14 = bottom_blob->w;
    iVar9 = bottom_blob->h;
    iVar10 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar14;
    top_blob->h = iVar9;
    top_blob->d = iVar10;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (uVar1 == 3) {
    if (bVar16) {
      if (bVar15) {
        if (bVar12) {
          Mat::reshape(&local_90,bottom_blob,1,opt->blob_allocator);
          if (&local_90 != top_blob) {
            if (local_90.refcount != (int *)0x0) {
              LOCK();
              *local_90.refcount = *local_90.refcount + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_90.data;
            top_blob->refcount = local_90.refcount;
            top_blob->elemsize = local_90.elemsize;
            top_blob->elempack = local_90.elempack;
            top_blob->allocator = local_90.allocator;
            top_blob->dims = local_90.dims;
            top_blob->w = local_90.w;
            top_blob->h = local_90.h;
            top_blob->d = local_90.d;
            top_blob->c = local_90.c;
            top_blob->cstep = local_90.cstep;
          }
          if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
          LOCK();
          *local_90.refcount = *local_90.refcount + -1;
          UNLOCK();
          if (*local_90.refcount != 0) goto LAB_004142dd;
          if (local_90.allocator != (Allocator *)0x0) {
            (*(local_90.allocator)->_vptr_Allocator[3])();
            goto LAB_004142dd;
          }
        }
        else {
          Mat::reshape(&local_90,bottom_blob,local_3c,opt->blob_allocator);
          if (&local_90 != top_blob) {
            if (local_90.refcount != (int *)0x0) {
              LOCK();
              *local_90.refcount = *local_90.refcount + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_90.data;
            top_blob->refcount = local_90.refcount;
            top_blob->elemsize = local_90.elemsize;
            top_blob->elempack = local_90.elempack;
            top_blob->allocator = local_90.allocator;
            top_blob->dims = local_90.dims;
            top_blob->w = local_90.w;
            top_blob->h = local_90.h;
            top_blob->d = local_90.d;
            top_blob->c = local_90.c;
            top_blob->cstep = local_90.cstep;
          }
          if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
          LOCK();
          *local_90.refcount = *local_90.refcount + -1;
          UNLOCK();
          if (*local_90.refcount != 0) goto LAB_004142dd;
          if (local_90.allocator != (Allocator *)0x0) {
            (*(local_90.allocator)->_vptr_Allocator[3])();
            goto LAB_004142dd;
          }
        }
      }
      else if (bVar12) {
        Mat::reshape(&local_90,bottom_blob,local_40,opt->blob_allocator);
        if (&local_90 != top_blob) {
          if (local_90.refcount != (int *)0x0) {
            LOCK();
            *local_90.refcount = *local_90.refcount + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_90.data;
          top_blob->refcount = local_90.refcount;
          top_blob->elemsize = local_90.elemsize;
          top_blob->elempack = local_90.elempack;
          top_blob->allocator = local_90.allocator;
          top_blob->dims = local_90.dims;
          top_blob->w = local_90.w;
          top_blob->h = local_90.h;
          top_blob->d = local_90.d;
          top_blob->c = local_90.c;
          top_blob->cstep = local_90.cstep;
        }
        if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount != 0) goto LAB_004142dd;
        if (local_90.allocator != (Allocator *)0x0) {
          (*(local_90.allocator)->_vptr_Allocator[3])();
          goto LAB_004142dd;
        }
      }
      else {
        Mat::reshape(&local_90,bottom_blob,local_40,local_3c,opt->blob_allocator);
        if (&local_90 != top_blob) {
          if (local_90.refcount != (int *)0x0) {
            LOCK();
            *local_90.refcount = *local_90.refcount + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_90.data;
          top_blob->refcount = local_90.refcount;
          top_blob->elemsize = local_90.elemsize;
          top_blob->elempack = local_90.elempack;
          top_blob->allocator = local_90.allocator;
          top_blob->dims = local_90.dims;
          top_blob->w = local_90.w;
          top_blob->h = local_90.h;
          top_blob->d = local_90.d;
          top_blob->c = local_90.c;
          top_blob->cstep = local_90.cstep;
        }
        if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount != 0) goto LAB_004142dd;
        if (local_90.allocator != (Allocator *)0x0) {
          (*(local_90.allocator)->_vptr_Allocator[3])();
          goto LAB_004142dd;
        }
      }
    }
    else if (bVar15) {
      if (bVar12) {
        Mat::reshape(&local_90,bottom_blob,local_44,opt->blob_allocator);
        if (&local_90 != top_blob) {
          if (local_90.refcount != (int *)0x0) {
            LOCK();
            *local_90.refcount = *local_90.refcount + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_90.data;
          top_blob->refcount = local_90.refcount;
          top_blob->elemsize = local_90.elemsize;
          top_blob->elempack = local_90.elempack;
          top_blob->allocator = local_90.allocator;
          top_blob->dims = local_90.dims;
          top_blob->w = local_90.w;
          top_blob->h = local_90.h;
          top_blob->d = local_90.d;
          top_blob->c = local_90.c;
          top_blob->cstep = local_90.cstep;
        }
        if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount != 0) goto LAB_004142dd;
        if (local_90.allocator != (Allocator *)0x0) {
          (*(local_90.allocator)->_vptr_Allocator[3])();
          goto LAB_004142dd;
        }
      }
      else {
        Mat::reshape(&local_90,bottom_blob,local_44,local_3c,opt->blob_allocator);
        if (&local_90 != top_blob) {
          if (local_90.refcount != (int *)0x0) {
            LOCK();
            *local_90.refcount = *local_90.refcount + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_90.data;
          top_blob->refcount = local_90.refcount;
          top_blob->elemsize = local_90.elemsize;
          top_blob->elempack = local_90.elempack;
          top_blob->allocator = local_90.allocator;
          top_blob->dims = local_90.dims;
          top_blob->w = local_90.w;
          top_blob->h = local_90.h;
          top_blob->d = local_90.d;
          top_blob->c = local_90.c;
          top_blob->cstep = local_90.cstep;
        }
        if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount != 0) goto LAB_004142dd;
        if (local_90.allocator != (Allocator *)0x0) {
          (*(local_90.allocator)->_vptr_Allocator[3])();
          goto LAB_004142dd;
        }
      }
    }
    else {
      if (!bVar12) goto LAB_004142dd;
      Mat::reshape(&local_90,bottom_blob,local_44,local_40,opt->blob_allocator);
      if (&local_90 != top_blob) {
        if (local_90.refcount != (int *)0x0) {
          LOCK();
          *local_90.refcount = *local_90.refcount + 1;
          UNLOCK();
        }
        piVar4 = top_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_90.data;
        top_blob->refcount = local_90.refcount;
        top_blob->elemsize = local_90.elemsize;
        top_blob->elempack = local_90.elempack;
        top_blob->allocator = local_90.allocator;
        top_blob->dims = local_90.dims;
        top_blob->w = local_90.w;
        top_blob->h = local_90.h;
        top_blob->d = local_90.d;
        top_blob->c = local_90.c;
        top_blob->cstep = local_90.cstep;
      }
      if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
      LOCK();
      *local_90.refcount = *local_90.refcount + -1;
      UNLOCK();
      if (*local_90.refcount != 0) goto LAB_004142dd;
      if (local_90.allocator != (Allocator *)0x0) {
        (*(local_90.allocator)->_vptr_Allocator[3])();
        goto LAB_004142dd;
      }
    }
  }
  else if (uVar1 == 2) {
    if (bVar16) {
      if (bVar15) {
        Mat::reshape(&local_90,bottom_blob,1,opt->blob_allocator);
        if (&local_90 != top_blob) {
          if (local_90.refcount != (int *)0x0) {
            LOCK();
            *local_90.refcount = *local_90.refcount + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_90.data;
          top_blob->refcount = local_90.refcount;
          top_blob->elemsize = local_90.elemsize;
          top_blob->elempack = local_90.elempack;
          top_blob->allocator = local_90.allocator;
          top_blob->dims = local_90.dims;
          top_blob->w = local_90.w;
          top_blob->h = local_90.h;
          top_blob->d = local_90.d;
          top_blob->c = local_90.c;
          top_blob->cstep = local_90.cstep;
        }
        if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount != 0) goto LAB_004142dd;
        if (local_90.allocator != (Allocator *)0x0) {
          (*(local_90.allocator)->_vptr_Allocator[3])();
          goto LAB_004142dd;
        }
      }
      else {
        Mat::reshape(&local_90,bottom_blob,local_40,opt->blob_allocator);
        if (&local_90 != top_blob) {
          if (local_90.refcount != (int *)0x0) {
            LOCK();
            *local_90.refcount = *local_90.refcount + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_90.data;
          top_blob->refcount = local_90.refcount;
          top_blob->elemsize = local_90.elemsize;
          top_blob->elempack = local_90.elempack;
          top_blob->allocator = local_90.allocator;
          top_blob->dims = local_90.dims;
          top_blob->w = local_90.w;
          top_blob->h = local_90.h;
          top_blob->d = local_90.d;
          top_blob->c = local_90.c;
          top_blob->cstep = local_90.cstep;
        }
        if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount != 0) goto LAB_004142dd;
        if (local_90.allocator != (Allocator *)0x0) {
          (*(local_90.allocator)->_vptr_Allocator[3])();
          goto LAB_004142dd;
        }
      }
    }
    else {
      if (!bVar15) goto LAB_004142dd;
      Mat::reshape(&local_90,bottom_blob,local_44,opt->blob_allocator);
      if (&local_90 != top_blob) {
        if (local_90.refcount != (int *)0x0) {
          LOCK();
          *local_90.refcount = *local_90.refcount + 1;
          UNLOCK();
        }
        piVar4 = top_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_90.data;
        top_blob->refcount = local_90.refcount;
        top_blob->elemsize = local_90.elemsize;
        top_blob->elempack = local_90.elempack;
        top_blob->allocator = local_90.allocator;
        top_blob->dims = local_90.dims;
        top_blob->w = local_90.w;
        top_blob->h = local_90.h;
        top_blob->d = local_90.d;
        top_blob->c = local_90.c;
        top_blob->cstep = local_90.cstep;
      }
      if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
      LOCK();
      *local_90.refcount = *local_90.refcount + -1;
      UNLOCK();
      if (*local_90.refcount != 0) goto LAB_004142dd;
      if (local_90.allocator != (Allocator *)0x0) {
        (*(local_90.allocator)->_vptr_Allocator[3])();
        goto LAB_004142dd;
      }
    }
  }
  else {
    if ((uVar1 != 1) || (!bVar16)) goto LAB_004142dd;
    Mat::reshape(&local_90,bottom_blob,1,opt->blob_allocator);
    if (&local_90 != top_blob) {
      if (local_90.refcount != (int *)0x0) {
        LOCK();
        *local_90.refcount = *local_90.refcount + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->data = local_90.data;
      top_blob->refcount = local_90.refcount;
      top_blob->elemsize = local_90.elemsize;
      top_blob->elempack = local_90.elempack;
      top_blob->allocator = local_90.allocator;
      top_blob->dims = local_90.dims;
      top_blob->w = local_90.w;
      top_blob->h = local_90.h;
      top_blob->d = local_90.d;
      top_blob->c = local_90.c;
      top_blob->cstep = local_90.cstep;
    }
    if (local_90.refcount == (int *)0x0) goto LAB_004142dd;
    LOCK();
    *local_90.refcount = *local_90.refcount + -1;
    UNLOCK();
    if (*local_90.refcount != 0) goto LAB_004142dd;
    if (local_90.allocator != (Allocator *)0x0) {
      (*(local_90.allocator)->_vptr_Allocator[3])();
      goto LAB_004142dd;
    }
  }
  free(local_90.data);
LAB_004142dd:
  if ((top_blob->data == (void *)0x0) || (iVar14 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar14 = -100;
  }
  return iVar14;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}